

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void BeginMode3D(Camera camera)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 in_stack_00000008 [12];
  undefined1 in_stack_00000014 [12];
  Matrix matView;
  float16 result;
  Matrix local_88;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  rlDrawRenderBatchActive();
  RLGL.State.currentMatrix = &RLGL.State.projection;
  RLGL.State.currentMatrixMode = 0x1701;
  rlPushMatrix();
  rlLoadIdentity();
  dVar4 = rlCullDistanceNear;
  uVar1 = (ulong)CORE.Window.currentFbo.width;
  uVar2 = (ulong)CORE.Window.currentFbo.height;
  if (matView.m1 == 1.4013e-45) {
    dVar3 = (double)matView.m12 * 0.5;
    dVar4 = (double)((float)uVar1 / (float)uVar2) * dVar3;
    rlOrtho(-dVar4,dVar4,-dVar3,dVar3,rlCullDistanceNear,rlCullDistanceFar);
  }
  else if (matView.m1 == 0.0) {
    dVar3 = tan((double)matView.m12 * 0.5 * 0.01745329238474369);
    dVar4 = dVar4 * dVar3;
    dVar3 = (double)((float)uVar1 / (float)uVar2) * dVar4;
    rlFrustum(-dVar3,dVar3,-dVar4,dVar4,rlCullDistanceNear,rlCullDistanceFar);
  }
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  rlLoadIdentity();
  MatrixLookAt(&local_88,(Vector3)in_stack_00000008,(Vector3)in_stack_00000014,
               (Vector3)matView._0_12_);
  local_48 = local_88.m0;
  local_44 = local_88.m1;
  local_40 = local_88.m2;
  local_3c = local_88.m3;
  local_38 = local_88.m4;
  local_34 = local_88.m5;
  local_30 = local_88.m6;
  local_2c = local_88.m7;
  local_28 = local_88.m8;
  local_24 = local_88.m9;
  local_20 = local_88.m10;
  local_1c = local_88.m11;
  local_18 = local_88.m12;
  local_14 = local_88.m13;
  local_10 = local_88.m14;
  local_c = local_88.m15;
  rlMultMatrixf(&local_48);
  (*glad_glEnable)(0xb71);
  return;
}

Assistant:

void BeginMode3D(Camera camera)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlMatrixMode(RL_PROJECTION);    // Switch to projection matrix
    rlPushMatrix();                 // Save previous matrix, which contains the settings for the 2d ortho projection
    rlLoadIdentity();               // Reset current matrix (projection)

    float aspect = (float)CORE.Window.currentFbo.width/(float)CORE.Window.currentFbo.height;

    // NOTE: zNear and zFar values are important when computing depth buffer values
    if (camera.projection == CAMERA_PERSPECTIVE)
    {
        // Setup perspective projection
        double top = rlGetCullDistanceNear()*tan(camera.fovy*0.5*DEG2RAD);
        double right = top*aspect;

        rlFrustum(-right, right, -top, top, rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }
    else if (camera.projection == CAMERA_ORTHOGRAPHIC)
    {
        // Setup orthographic projection
        double top = camera.fovy/2.0;
        double right = top*aspect;

        rlOrtho(-right, right, -top,top, rlGetCullDistanceNear(), rlGetCullDistanceFar());
    }

    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)

    // Setup Camera view
    Matrix matView = MatrixLookAt(camera.position, camera.target, camera.up);
    rlMultMatrixf(MatrixToFloat(matView));      // Multiply modelview matrix by view matrix (camera)

    rlEnableDepthTest();            // Enable DEPTH_TEST for 3D
}